

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void __thiscall FConsoleAlias::Archive(FConsoleAlias *this,FConfigFile *f)

{
  if ((f != (FConfigFile *)0x0) && (*(int *)(this->m_Command[0].Chars + -0xc) != 0)) {
    FConfigFile::SetValueForKey(f,"Name",(this->super_FConsoleCommand).m_Name,true);
    FConfigFile::SetValueForKey(f,"Command",this->m_Command[0].Chars,true);
    return;
  }
  return;
}

Assistant:

void FConsoleAlias::Archive (FConfigFile *f)
{
	if (f != NULL && !m_Command[0].IsEmpty())
	{
		f->SetValueForKey ("Name", m_Name, true);
		f->SetValueForKey ("Command", m_Command[0], true);
	}
}